

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathFrustum.h
# Opt level: O3

float __thiscall
Imath_3_2::Frustum<float>::worldRadiusExc(Frustum<float> *this,Vec3<float> *p,float radius)

{
  float fVar1;
  domain_error *this_00;
  float fVar2;
  float fVar3;
  float fVar4;
  
  fVar1 = this->_nearPlane;
  fVar2 = -fVar1;
  fVar3 = fVar2;
  if (fVar2 <= fVar1) {
    fVar3 = fVar1;
  }
  fVar1 = p->z;
  if (fVar3 <= 1.0) {
    fVar4 = fVar1;
    if (fVar1 <= -fVar1) {
      fVar4 = -fVar1;
    }
    if (fVar3 * 3.4028235e+38 <= fVar4) {
      this_00 = (domain_error *)__cxa_allocate_exception(0x10);
      std::domain_error::domain_error
                (this_00,"Bad viewing frustum: near clipping plane is too close to zero");
      __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
    }
  }
  return (fVar1 / fVar2) * radius;
}

Assistant:

IMATH_CONSTEXPR14 T
Frustum<T>::worldRadiusExc (const Vec3<T>& p, T radius) const
{
    if (abs (-_nearPlane) > T (1) ||
        abs (p.z) < std::numeric_limits<T>::max () * abs (-_nearPlane))
    {
        return radius * (p.z / -_nearPlane);
    }
    else
    {
        throw std::domain_error ("Bad viewing frustum: "
                                 "near clipping plane is too close to zero");
    }
}